

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib651.c
# Opt level: O1

int test(char *URL)

{
  int iVar1;
  byte bVar2;
  long lVar3;
  curl_httppost *formpost;
  curl_httppost *lastptr;
  undefined8 local_30;
  undefined8 local_28;
  
  lVar3 = 0;
  local_30 = 0;
  local_28 = 0;
  bVar2 = 0x41;
  do {
    memset(buffer + lVar3,(uint)bVar2,1000);
    bVar2 = bVar2 + 1;
    lVar3 = lVar3 + 1000;
  } while (lVar3 != 17000);
  buffer[16999] = '\0';
  iVar1 = curl_global_init(3);
  if (iVar1 == 0) {
    iVar1 = curl_formadd(&local_30,&local_28,1,"hello",4,buffer,0x11);
    if (iVar1 != 0) {
      curl_mprintf("curl_formadd(1) = %d\n",iVar1);
    }
    lVar3 = curl_easy_init();
    if (lVar3 != 0) {
      iVar1 = curl_easy_setopt(lVar3,0x2712,URL);
      if ((((iVar1 == 0) && (iVar1 = curl_easy_setopt(lVar3,0x2728,local_30), iVar1 == 0)) &&
          (iVar1 = curl_easy_setopt(lVar3,0x29,1), iVar1 == 0)) &&
         (iVar1 = curl_easy_setopt(lVar3,0x2a,1), iVar1 == 0)) {
        iVar1 = curl_easy_perform(lVar3);
      }
      curl_easy_cleanup(lVar3);
      curl_formfree(local_30);
      curl_global_cleanup();
      return iVar1;
    }
    curl_mfprintf(_stderr,"curl_easy_init() failed\n");
    curl_formfree(local_30);
    curl_global_cleanup();
  }
  else {
    curl_mfprintf(_stderr,"curl_global_init() failed\n");
  }
  return 0x7e;
}

Assistant:

int test(char *URL)
{
  CURL *curl;
  CURLcode res = CURLE_OK;
  CURLFORMcode formrc;
  struct curl_httppost *formpost = NULL;
  struct curl_httppost *lastptr = NULL;

  /* create a buffer with AAAA...BBBBB...CCCC...etc */
  int i;
  int size = (int)sizeof(buffer)/1000;

  for(i = 0; i < size ; i++)
    memset(&buffer[i * 1000], 65 + i, 1000);

  buffer[ sizeof(buffer)-1] = 0; /* zero terminate */

  if(curl_global_init(CURL_GLOBAL_ALL) != CURLE_OK) {
    fprintf(stderr, "curl_global_init() failed\n");
    return TEST_ERR_MAJOR_BAD;
  }

  /* Check proper name and data copying. */
  formrc = curl_formadd(&formpost, &lastptr,
                        CURLFORM_COPYNAME, "hello",
                        CURLFORM_COPYCONTENTS, buffer,
                        CURLFORM_END);

  if(formrc)
    printf("curl_formadd(1) = %d\n", (int) formrc);


  curl = curl_easy_init();
  if(!curl) {
    fprintf(stderr, "curl_easy_init() failed\n");
    curl_formfree(formpost);
    curl_global_cleanup();
    return TEST_ERR_MAJOR_BAD;
  }

  /* First set the URL that is about to receive our POST. */
  test_setopt(curl, CURLOPT_URL, URL);

  /* send a multi-part formpost */
  test_setopt(curl, CURLOPT_HTTPPOST, formpost);

  /* get verbose debug output please */
  test_setopt(curl, CURLOPT_VERBOSE, 1L);

  /* include headers in the output */
  test_setopt(curl, CURLOPT_HEADER, 1L);

  /* Perform the request, res will get the return code */
  res = curl_easy_perform(curl);

test_cleanup:

  /* always cleanup */
  curl_easy_cleanup(curl);

  /* now cleanup the formpost chain */
  curl_formfree(formpost);

  curl_global_cleanup();

  return res;
}